

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>_>
::next_byte_in_range
          (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>_>
           *this,initializer_list<int> ranges)

{
  const_iterator piVar1;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>_>
  *in_RDI;
  const_iterator range;
  char_int_type in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  int *local_28;
  initializer_list<int> local_18;
  
  add((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>_>
       *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
  local_28 = std::initializer_list<int>::begin(&local_18);
  while( true ) {
    piVar1 = std::initializer_list<int>::end
                       ((initializer_list<int> *)
                        CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    if (local_28 == piVar1) {
      return true;
    }
    get(in_RDI);
    in_stack_ffffffffffffffc7 = false;
    if (*local_28 <= in_RDI->current) {
      in_stack_ffffffffffffffc7 = in_RDI->current <= local_28[1];
      local_28 = local_28 + 1;
    }
    if ((bool)in_stack_ffffffffffffffc7 == false) break;
    add((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>_>
         *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
    local_28 = local_28 + 1;
  }
  in_RDI->error_message = "invalid string: ill-formed UTF-8 byte";
  return false;
}

Assistant:

bool next_byte_in_range(std::initializer_list<char_int_type> ranges)
    {
        JSON_ASSERT(ranges.size() == 2 || ranges.size() == 4 || ranges.size() == 6);
        add(current);

        for (auto range = ranges.begin(); range != ranges.end(); ++range)
        {
            get();
            if (JSON_HEDLEY_LIKELY(*range <= current && current <= *(++range)))
            {
                add(current);
            }
            else
            {
                error_message = "invalid string: ill-formed UTF-8 byte";
                return false;
            }
        }

        return true;
    }